

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTestContiguous.cpp
# Opt level: O2

int __thiscall
Hpipe::InstructionTestContiguous::clone
          (InstructionTestContiguous *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,
          ...)

{
  InstructionNone *pIVar1;
  InstructionTestContiguous *pIVar2;
  Context CStack_98;
  
  if ((___flags[1] - (long)*___flags == 4) && (*(int *)*___flags == 1)) {
    pIVar1 = (InstructionNone *)operator_new(0x178);
    Context::Context(&CStack_98,(Context *)__child_stack);
    InstructionNone::Instruction(pIVar1,&CStack_98);
    pIVar1 = PtrPool<Hpipe::Instruction,32>::operator<<
                       ((PtrPool<Hpipe::Instruction,32> *)__fn,pIVar1);
    Context::~Context(&CStack_98);
    return (int)pIVar1;
  }
  pIVar2 = (InstructionTestContiguous *)operator_new(0x180);
  InstructionTestContiguous
            (pIVar2,(Context *)__child_stack,(bool)(this->super_Instruction).field_0x174,
             this->nb_chars);
  pIVar2 = PtrPool<Hpipe::Instruction,32>::operator<<((PtrPool<Hpipe::Instruction,32> *)__fn,pIVar2)
  ;
  return (int)pIVar2;
}

Assistant:

Instruction *InstructionTestContiguous::clone( PtrPool<Instruction> &inst_pool, const Context &ncx, const Vec<unsigned> &keep_ind ) {
    if ( keep_ind.size() == 1 and keep_ind[ 0 ] == 1 )
        return inst_pool << new InstructionNone( ncx );
    return inst_pool << new InstructionTestContiguous( ncx, beg, nb_chars );
}